

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O2

Ivy_Obj_t ** Ivy_ObjNextPrevFanoutPlace(Ivy_Obj_t *pObj,Ivy_Obj_t *pFanout)

{
  uint __line;
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t **ppIVar2;
  char *__assertion;
  
  if (((ulong)pObj & 1) == 0) {
    if (((ulong)pFanout & 1) == 0) {
      pIVar1 = Ivy_ObjNextFanout(pObj,pFanout);
      if (pIVar1 == (Ivy_Obj_t *)0x0) {
        ppIVar2 = (Ivy_Obj_t **)0x0;
      }
      else if ((Ivy_Obj_t *)((ulong)pIVar1->pFanin0 & 0xfffffffffffffffe) == pObj) {
        ppIVar2 = &pIVar1->pPrevFan0;
      }
      else {
        if ((Ivy_Obj_t *)((ulong)pIVar1->pFanin1 & 0xfffffffffffffffe) != pObj) {
          __assertion = "Ivy_ObjFanin1(pTemp) == pObj";
          __line = 0x68;
          goto LAB_00624700;
        }
        ppIVar2 = &pIVar1->pPrevFan1;
      }
      return ppIVar2;
    }
    __assertion = "!Ivy_IsComplement(pFanout)";
    __line = 0x62;
  }
  else {
    __assertion = "!Ivy_IsComplement(pObj)";
    __line = 0x61;
  }
LAB_00624700:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                ,__line,"Ivy_Obj_t **Ivy_ObjNextPrevFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
}

Assistant:

static inline Ivy_Obj_t ** Ivy_ObjNextPrevFanoutPlace( Ivy_Obj_t * pObj, Ivy_Obj_t * pFanout )
{
    Ivy_Obj_t * pTemp;
    assert( !Ivy_IsComplement(pObj) );
    assert( !Ivy_IsComplement(pFanout) );
    pTemp = Ivy_ObjNextFanout(pObj, pFanout);
    if ( pTemp == NULL )
        return NULL;
    if ( Ivy_ObjFanin0(pTemp) == pObj )
        return &pTemp->pPrevFan0;
    assert( Ivy_ObjFanin1(pTemp) == pObj );
    return &pTemp->pPrevFan1;
}